

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_interface.c
# Opt level: O1

long CMprobe_latency(CMConnection conn,long msg_size,attr_list attrs)

{
  CManager cm;
  long lVar1;
  
  cm = conn->cm;
  IntCManager_lock(cm,
                   "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/build_O1/thirdparty/EVPath/EVPath/cm_interface.c"
                   ,0x1df);
  lVar1 = INT_CMprobe_latency(conn,(int)msg_size,attrs);
  IntCManager_unlock(cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/build_O1/thirdparty/EVPath/EVPath/cm_interface.c"
                     ,0x1e1);
  return lVar1;
}

Assistant:

extern long
CMprobe_latency ( CMConnection conn, long msg_size, attr_list attrs )
{
	long ret;
	CManager cm = conn->cm;
	CManager_lock(cm);
	ret = INT_CMprobe_latency(conn, msg_size, attrs);
	CManager_unlock(cm);
	return ret;
}